

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewFrame(void)

{
  ImDrawListFlags *pIVar1;
  ImDrawList *pIVar2;
  float *pfVar3;
  int *piVar4;
  ImGuiNextWindowData *pIVar5;
  ImGuiNavMoveResult *pIVar6;
  bool *pbVar7;
  ImVec2 *pIVar8;
  ImGuiID IVar9;
  ImGuiInputSource IVar10;
  ImGuiID IVar11;
  ImGuiContextHook *pIVar12;
  ImFontAtlas *pIVar13;
  uint *puVar14;
  ImGuiWindow **ppIVar15;
  ImGuiPopupData *pIVar16;
  int *piVar17;
  ImGuiGroupData *pIVar18;
  float fVar19;
  ImGuiContext *pIVar20;
  ImGuiContext *pIVar21;
  ImGuiContext *pIVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  int iVar26;
  ImGuiContext *g_4;
  uint *__dest;
  ImGuiWindow *pIVar27;
  ImGuiWindow **__dest_00;
  ImGuiPopupData *__dest_01;
  int *piVar28;
  ImGuiGroupData *__dest_02;
  int i;
  uint uVar29;
  ImGuiWindow *window;
  char *pcVar30;
  ImGuiWindow *parent;
  ImGuiWindow *pIVar31;
  ImGuiContext *g;
  int iVar32;
  ulong uVar33;
  ImRect *pIVar34;
  float *pfVar35;
  ImGuiNavLayer IVar36;
  ImFont *font;
  float *pfVar37;
  byte bVar38;
  ImGuiContext *g_3;
  ImGuiContext *pIVar39;
  ImGuiWindow *old_nav_window;
  ImGuiNavMoveResult *pIVar40;
  byte bVar41;
  ImGuiContext *g_6;
  long lVar42;
  ImGuiContext *g_1;
  long lVar43;
  ulong uVar44;
  bool bVar45;
  uint uVar46;
  float fVar47;
  float fVar48;
  ImVec2 IVar49;
  ImVec2 IVar50;
  ImVec2 IVar51;
  ImVec2 IVar52;
  double dVar53;
  ImVec2 IVar54;
  ImVec2 IVar55;
  float fVar56;
  ImVec2 IVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  ImRect local_48;
  ulong local_38;
  
  pIVar20 = GImGui;
  bVar41 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0xec5,"void ImGui::NewFrame()");
  }
  if (0 < (GImGui->Hooks).Size) {
    lVar42 = 0;
    lVar43 = 0;
    do {
      pIVar12 = (pIVar20->Hooks).Data;
      if (*(int *)(pIVar12 + lVar42) == 0) {
        (**(code **)(pIVar12 + lVar42 + 8))(pIVar20,pIVar12 + lVar42);
      }
      lVar43 = lVar43 + 1;
      lVar42 = lVar42 + 0x18;
    } while (lVar43 < (pIVar20->Hooks).Size);
  }
  pIVar21 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b32,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DeltaTime <= 0.0) && (GImGui->FrameCount != 0)) {
    __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b33,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->FrameCount != 0) && (GImGui->FrameCountEnded != GImGui->FrameCount)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b34,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b35,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar13 = (GImGui->IO).Fonts;
  if ((pIVar13->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b36,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((*(pIVar13->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b37,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b38,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CircleSegmentMaxError <= 0.0) {
    __assert_fail("g.Style.CircleSegmentMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b39,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar47 = (GImGui->Style).Alpha;
  if ((fVar47 < 0.0) || (1.0 < fVar47)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b3a,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b3b,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (GImGui->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b3c,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar42 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar42] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown)))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                    ,0x1b3e,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    lVar42 = lVar42 + 1;
  } while (lVar42 != 0x16);
  if ((((GImGui->IO).ConfigFlags & 1) != 0) && ((GImGui->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x1b42,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar21->SettingsLoaded == false) {
    if ((pIVar21->SettingsWindows).Buf.Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                    ,0x273b,"void ImGui::UpdateSettings()");
    }
    pcVar30 = (pIVar21->IO).IniFilename;
    if (pcVar30 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar30);
    }
    pIVar21->SettingsLoaded = true;
  }
  if ((0.0 < pIVar21->SettingsDirtyTimer) &&
     (fVar47 = pIVar21->SettingsDirtyTimer - (pIVar21->IO).DeltaTime,
     pIVar21->SettingsDirtyTimer = fVar47, fVar47 <= 0.0)) {
    pcVar30 = (pIVar21->IO).IniFilename;
    if (pcVar30 == (char *)0x0) {
      (pIVar21->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar30);
    }
    pIVar21->SettingsDirtyTimer = 0.0;
  }
  pIVar20->Time = (double)(pIVar20->IO).DeltaTime + pIVar20->Time;
  pIVar20->WithinFrameScope = true;
  pIVar20->FrameCount = pIVar20->FrameCount + 1;
  pIVar20->TooltipOverrideCount = 0;
  pIVar20->WindowsActiveCount = 0;
  iVar32 = (pIVar20->MenusIdSubmittedThisFrame).Capacity;
  if (iVar32 < 0) {
    uVar29 = iVar32 / 2 + iVar32;
    uVar46 = 0;
    if (0 < (int)uVar29) {
      uVar46 = uVar29;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar17 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar17 = *piVar17 + 1;
    }
    __dest = (uint *)(*GImAllocatorAllocFunc)((ulong)uVar46 * 4,GImAllocatorUserData);
    puVar14 = (pIVar20->MenusIdSubmittedThisFrame).Data;
    if (puVar14 != (uint *)0x0) {
      memcpy(__dest,puVar14,(long)(pIVar20->MenusIdSubmittedThisFrame).Size << 2);
      puVar14 = (pIVar20->MenusIdSubmittedThisFrame).Data;
      if ((puVar14 != (uint *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar17 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar17 = *piVar17 + -1;
      }
      (*GImAllocatorFreeFunc)(puVar14,GImAllocatorUserData);
    }
    (pIVar20->MenusIdSubmittedThisFrame).Data = __dest;
    (pIVar20->MenusIdSubmittedThisFrame).Capacity = uVar46;
  }
  (pIVar20->MenusIdSubmittedThisFrame).Size = 0;
  fVar47 = (pIVar20->IO).DeltaTime;
  iVar32 = pIVar20->FramerateSecPerFrameIdx;
  pIVar20->FramerateSecPerFrameAccum =
       (fVar47 - pIVar20->FramerateSecPerFrame[iVar32]) + pIVar20->FramerateSecPerFrameAccum;
  pIVar20->FramerateSecPerFrame[iVar32] = fVar47;
  iVar26 = iVar32 + (int)((ulong)((long)(iVar32 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar20->FramerateSecPerFrameIdx = iVar32 + 1 + ((iVar26 >> 6) - (iVar26 >> 0x1f)) * -0x78;
  uVar46 = -(uint)(0.0 < pIVar20->FramerateSecPerFrameAccum);
  (pIVar20->IO).Framerate =
       (float)(~uVar46 & 0x7f7fffff |
              (uint)(1.0 / (pIVar20->FramerateSecPerFrameAccum / 120.0)) & uVar46);
  ((pIVar20->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    pIVar13 = (GImGui->IO).Fonts;
    if ((pIVar13->Fonts).Size < 1) {
      pcVar30 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_00179dde:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.h"
                    ,0x658,pcVar30);
    }
    font = *(pIVar13->Fonts).Data;
  }
  SetCurrentFont(font);
  if (pIVar20->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0xee0,"void ImGui::NewFrame()");
  }
  fVar47 = (pIVar20->IO).DisplaySize.x;
  fVar48 = (pIVar20->IO).DisplaySize.y;
  (pIVar20->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar20->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar20->DrawListSharedData).ClipRectFullscreen.z = fVar47;
  (pIVar20->DrawListSharedData).ClipRectFullscreen.w = fVar48;
  (pIVar20->DrawListSharedData).CurveTessellationTol = (pIVar20->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleSegmentMaxError
            (&pIVar20->DrawListSharedData,(pIVar20->Style).CircleSegmentMaxError);
  uVar46 = (uint)(pIVar20->Style).AntiAliasedLines;
  (pIVar20->DrawListSharedData).InitialFlags = uVar46;
  if (((pIVar20->Style).AntiAliasedLinesUseTex == true) &&
     ((pIVar20->Font->ContainerAtlas->Flags & 4) == 0)) {
    (pIVar20->DrawListSharedData).InitialFlags = uVar46 | 2;
  }
  if ((pIVar20->Style).AntiAliasedFill == true) {
    pIVar1 = &(pIVar20->DrawListSharedData).InitialFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  if (((pIVar20->IO).BackendFlags & 8) != 0) {
    pIVar1 = &(pIVar20->DrawListSharedData).InitialFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 8;
  }
  pIVar2 = &pIVar20->BackgroundDrawList;
  ImDrawList::_ResetForNewFrame(pIVar2);
  ImDrawList::PushTextureID(pIVar2,((pIVar20->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar2);
  pIVar2 = &pIVar20->ForegroundDrawList;
  ImDrawList::_ResetForNewFrame(pIVar2);
  ImDrawList::PushTextureID(pIVar2,((pIVar20->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar2);
  (pIVar20->DrawData).Valid = false;
  (pIVar20->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar20->DrawData).CmdListsCount = 0;
  (pIVar20->DrawData).TotalIdxCount = 0;
  (pIVar20->DrawData).TotalVtxCount = 0;
  (pIVar20->DrawData).DisplayPos.x = 0.0;
  *(undefined8 *)&(pIVar20->DrawData).DisplayPos.y = 0;
  (pIVar20->DrawData).DisplaySize.x = 0.0;
  (pIVar20->DrawData).DisplaySize.y = 0.0;
  (pIVar20->DrawData).FramebufferScale.x = 0.0;
  pIVar21 = GImGui;
  (pIVar20->DrawData).FramebufferScale.y = 0.0;
  if ((pIVar20->DragDropActive == true) &&
     (IVar9 = (pIVar20->DragDropPayload).SourceId, IVar9 == pIVar20->ActiveId)) {
    if (GImGui->ActiveId == IVar9) {
      GImGui->ActiveIdIsAlive = IVar9;
    }
    if (pIVar21->ActiveIdPreviousFrame == IVar9) {
      pIVar21->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar20->HoveredIdPreviousFrame == 0) {
    pIVar20->HoveredIdTimer = 0.0;
LAB_0017702d:
    pIVar20->HoveredIdNotActiveTimer = 0.0;
  }
  else if ((pIVar20->HoveredId != 0) && (pIVar20->ActiveId == pIVar20->HoveredId))
  goto LAB_0017702d;
  IVar9 = pIVar20->HoveredId;
  if ((IVar9 != 0) &&
     (pIVar20->HoveredIdTimer = (pIVar20->IO).DeltaTime + pIVar20->HoveredIdTimer,
     pIVar20->ActiveId != IVar9)) {
    pIVar20->HoveredIdNotActiveTimer = (pIVar20->IO).DeltaTime + pIVar20->HoveredIdNotActiveTimer;
  }
  pIVar20->HoveredIdPreviousFrame = IVar9;
  pIVar20->HoveredIdPreviousFrameUsingMouseWheel = pIVar20->HoveredIdUsingMouseWheel;
  pIVar20->HoveredId = 0;
  pIVar20->HoveredIdAllowOverlap = false;
  pIVar20->HoveredIdUsingMouseWheel = false;
  pIVar20->HoveredIdDisabled = false;
  IVar9 = pIVar20->ActiveId;
  if (((pIVar20->ActiveIdIsAlive != IVar9) && (IVar9 != 0)) &&
     (pIVar20->ActiveIdPreviousFrame == IVar9)) {
    SetActiveID(0,(ImGuiWindow *)0x0);
  }
  IVar9 = pIVar20->ActiveId;
  if (IVar9 != 0) {
    pIVar20->ActiveIdTimer = (pIVar20->IO).DeltaTime + pIVar20->ActiveIdTimer;
  }
  pIVar20->LastActiveIdTimer = (pIVar20->IO).DeltaTime + pIVar20->LastActiveIdTimer;
  pIVar20->ActiveIdPreviousFrame = IVar9;
  pIVar20->ActiveIdPreviousFrameWindow = pIVar20->ActiveIdWindow;
  pIVar20->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar20->ActiveIdHasBeenEditedBefore;
  pIVar20->ActiveIdIsAlive = 0;
  pIVar20->ActiveIdHasBeenEditedThisFrame = false;
  pIVar20->ActiveIdPreviousFrameIsAlive = false;
  pIVar20->ActiveIdIsJustActivated = false;
  if (IVar9 != pIVar20->TempInputId && pIVar20->TempInputId != 0) {
    pIVar20->TempInputId = 0;
  }
  if (IVar9 == 0) {
    pIVar20->ActiveIdUsingNavDirMask = 0;
    pIVar20->ActiveIdUsingNavInputMask = 0;
    pIVar20->ActiveIdUsingKeyInputMask = 0;
  }
  pIVar20->DragDropAcceptIdPrev = pIVar20->DragDropAcceptIdCurr;
  pIVar20->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar20->DragDropAcceptIdCurr = 0;
  pIVar20->DragDropWithinSource = false;
  pIVar20->DragDropWithinTarget = false;
  pIVar20->DragDropHoldJustPressedId = 0;
  pIVar21 = GImGui;
  bVar24 = (GImGui->IO).KeyCtrl;
  uVar46 = bVar24 + 2;
  if ((GImGui->IO).KeyShift == false) {
    uVar46 = (uint)bVar24;
  }
  uVar29 = uVar46 + 4;
  if ((GImGui->IO).KeyAlt == false) {
    uVar29 = uVar46;
  }
  uVar46 = uVar29 + 8;
  if ((GImGui->IO).KeySuper == false) {
    uVar46 = uVar29;
  }
  (pIVar20->IO).KeyMods = uVar46;
  memcpy((pIVar20->IO).KeysDownDurationPrev,(pIVar20->IO).KeysDownDuration,0x800);
  lVar42 = 0x144;
  do {
    fVar47 = -1.0;
    if (*(char *)((long)(pIVar20->IO).KeyMap + lVar42 + -0x3c) == '\x01') {
      fVar48 = *(float *)((long)pIVar20 + lVar42 * 4 + -0x70);
      fVar47 = 0.0;
      if (0.0 <= fVar48) {
        fVar47 = fVar48 + (pIVar20->IO).DeltaTime;
      }
    }
    *(float *)((long)pIVar20 + lVar42 * 4 + -0x70) = fVar47;
    lVar42 = lVar42 + 1;
  } while (lVar42 != 0x344);
  (pIVar21->IO).WantSetMousePos = false;
  pIVar21->NavWrapRequestWindow = (ImGuiWindow *)0x0;
  pIVar21->NavWrapRequestFlags = 0;
  uVar46 = (pIVar21->IO).ConfigFlags;
  if ((uVar46 & 2) == 0) {
    bVar38 = 0;
  }
  else {
    bVar38 = (byte)(pIVar21->IO).BackendFlags & 1;
  }
  if (((bVar38 != 0) && (pIVar21->NavInputSource != ImGuiInputSource_NavGamepad)) &&
     (((0.0 < (pIVar21->IO).NavInputs[0] ||
       ((0.0 < (pIVar21->IO).NavInputs[2] || (0.0 < (pIVar21->IO).NavInputs[1])))) ||
      ((0.0 < (pIVar21->IO).NavInputs[3] ||
       ((((0.0 < (pIVar21->IO).NavInputs[4] || (0.0 < (pIVar21->IO).NavInputs[5])) ||
         (0.0 < (pIVar21->IO).NavInputs[6])) || (0.0 < (pIVar21->IO).NavInputs[7])))))))) {
    pIVar21->NavInputSource = ImGuiInputSource_NavGamepad;
  }
  if ((uVar46 & 1) != 0) {
    iVar32 = (pIVar21->IO).KeyMap[0xc];
    if (-1 < (long)iVar32) {
      if (0x1ff < iVar32) goto LAB_00179de8;
      if ((pIVar21->IO).KeysDown[iVar32] == true) {
        (pIVar21->IO).NavInputs[0] = 1.0;
        pIVar21->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar32 = (pIVar21->IO).KeyMap[0xd];
    if (-1 < (long)iVar32) {
      if (0x1ff < iVar32) goto LAB_00179de8;
      if ((pIVar21->IO).KeysDown[iVar32] == true) {
        (pIVar21->IO).NavInputs[2] = 1.0;
        pIVar21->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar32 = (pIVar21->IO).KeyMap[0xe];
    if (-1 < (long)iVar32) {
      if (0x1ff < iVar32) goto LAB_00179de8;
      if ((pIVar21->IO).KeysDown[iVar32] == true) {
        (pIVar21->IO).NavInputs[1] = 1.0;
        pIVar21->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar32 = (pIVar21->IO).KeyMap[1];
    if (-1 < (long)iVar32) {
      if (0x1ff < iVar32) goto LAB_00179de8;
      if ((pIVar21->IO).KeysDown[iVar32] == true) {
        (pIVar21->IO).NavInputs[0x11] = 1.0;
        pIVar21->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar32 = (pIVar21->IO).KeyMap[2];
    if (-1 < (long)iVar32) {
      if (0x1ff < iVar32) goto LAB_00179de8;
      if ((pIVar21->IO).KeysDown[iVar32] == true) {
        (pIVar21->IO).NavInputs[0x12] = 1.0;
        pIVar21->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar32 = (pIVar21->IO).KeyMap[3];
    if (-1 < (long)iVar32) {
      if (0x1ff < iVar32) goto LAB_00179de8;
      if ((pIVar21->IO).KeysDown[iVar32] == true) {
        (pIVar21->IO).NavInputs[0x13] = 1.0;
        pIVar21->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar32 = (pIVar21->IO).KeyMap[4];
    if (-1 < (long)iVar32) {
      if (0x1ff < iVar32) {
LAB_00179de8:
        __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(g.IO.KeysDown) / sizeof(*(g.IO.KeysDown))))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                      ,0x1185,"bool ImGui::IsKeyDown(int)");
      }
      if ((pIVar21->IO).KeysDown[iVar32] == true) {
        (pIVar21->IO).NavInputs[0x14] = 1.0;
        pIVar21->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    bVar24 = (pIVar21->IO).KeyCtrl;
    if (bVar24 == true) {
      (pIVar21->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar21->IO).KeyShift == true) {
      (pIVar21->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar24 == false) && ((pIVar21->IO).KeyAlt != false)) {
      (pIVar21->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar3 = (pIVar21->IO).NavInputsDownDuration;
  pfVar35 = pfVar3;
  pfVar37 = (pIVar21->IO).NavInputsDownDurationPrev;
  for (lVar42 = 0x15; lVar42 != 0; lVar42 = lVar42 + -1) {
    *pfVar37 = *pfVar35;
    pfVar35 = pfVar35 + (ulong)bVar41 * -2 + 1;
    pfVar37 = pfVar37 + (ulong)bVar41 * -2 + 1;
  }
  lVar42 = 0;
  do {
    fVar47 = -1.0;
    if (0.0 < (pIVar21->IO).NavInputs[lVar42]) {
      fVar47 = 0.0;
      if (0.0 <= pfVar3[lVar42]) {
        fVar47 = pfVar3[lVar42] + (pIVar21->IO).DeltaTime;
      }
    }
    pfVar3[lVar42] = fVar47;
    lVar42 = lVar42 + 1;
  } while (lVar42 != 0x15);
  IVar9 = pIVar21->NavInitResultId;
  if (((IVar9 != 0) &&
      ((pIVar21->NavDisableHighlight != true || (pIVar21->NavInitRequestFromMove == true)))) &&
     (pIVar21->NavWindow != (ImGuiWindow *)0x0)) {
    IVar36 = pIVar21->NavLayer;
    if (pIVar21->NavInitRequestFromMove == true) {
      SetNavID(IVar9,IVar36,0);
      IVar49 = (pIVar21->NavInitResultRectRel).Max;
      pIVar8 = &pIVar21->NavWindow->NavRectRel[(int)IVar36].Min;
      *pIVar8 = (pIVar21->NavInitResultRectRel).Min;
      pIVar8[1] = IVar49;
      pIVar21->NavMousePosDirty = true;
      pIVar21->NavDisableHighlight = false;
      pIVar21->NavDisableMouseHover = true;
    }
    else {
      SetNavID(IVar9,IVar36,0);
    }
    IVar49 = (pIVar21->NavInitResultRectRel).Max;
    pIVar8 = &pIVar21->NavWindow->NavRectRel[pIVar21->NavLayer].Min;
    *pIVar8 = (pIVar21->NavInitResultRectRel).Min;
    pIVar8[1] = IVar49;
  }
  pIVar21->NavInitRequest = false;
  pIVar21->NavInitRequestFromMove = false;
  pIVar21->NavInitResultId = 0;
  pIVar21->NavJustMovedToId = 0;
  pIVar22 = GImGui;
  if (pIVar21->NavMoveRequest == true) {
    IVar9 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar9 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      pIVar39 = GImGui;
      if (GImGui->NavId == 0) goto LAB_0017781e;
    }
    else {
      pIVar6 = &GImGui->NavMoveResultOther;
      pIVar40 = &GImGui->NavMoveResultLocal;
      if (IVar9 == 0) {
        pIVar40 = pIVar6;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20U) != 0) &&
          (IVar9 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar9 != 0)) &&
         (IVar9 != GImGui->NavId)) {
        pIVar40 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (((pIVar40 != pIVar6) && ((GImGui->NavMoveResultOther).ID != 0)) &&
         (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar47 = (GImGui->NavMoveResultOther).DistBox;
        fVar48 = pIVar40->DistBox;
        if (fVar48 <= fVar47) {
          if (((fVar47 != fVar48) || (NAN(fVar47) || NAN(fVar48))) ||
             (pfVar3 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar40->DistCenter < *pfVar3 || pIVar40->DistCenter == *pfVar3)) goto LAB_0017769a;
        }
        pIVar40 = pIVar6;
      }
LAB_0017769a:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) ||
         (pIVar27 = pIVar40->Window, pIVar27 == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                      ,0x2399,"void ImGui::NavUpdateMoveResult()");
      }
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        if ((GImGui->NavMoveRequestFlags & 0x40U) == 0) {
          fVar47 = (pIVar40->Window->Pos).x;
          fVar48 = (pIVar40->Window->Pos).y;
          local_48.Min.x = (pIVar40->RectRel).Min.x + fVar47;
          local_48.Max.x = fVar47 + (pIVar40->RectRel).Max.x;
          local_48.Min.y = (pIVar40->RectRel).Min.y + fVar48;
          local_48.Max.y = fVar48 + (pIVar40->RectRel).Max.y;
          IVar49 = ScrollToBringRectIntoView(pIVar40->Window,&local_48);
        }
        else {
          fVar47 = 0.0;
          if (GImGui->NavMoveDir == 2) {
            fVar47 = (pIVar27->ScrollMax).y;
          }
          IVar49 = (ImVec2)((ulong)(uint)((pIVar27->Scroll).y - fVar47) << 0x20);
          (pIVar27->ScrollTarget).y = fVar47;
          (pIVar27->ScrollTargetCenterRatio).y = 0.0;
          (pIVar27->ScrollTargetEdgeSnapDist).y = 0.0;
        }
        fVar47 = (pIVar40->RectRel).Min.y;
        (pIVar40->RectRel).Min.x = (pIVar40->RectRel).Min.x - IVar49.x;
        (pIVar40->RectRel).Max.x = (pIVar40->RectRel).Max.x - IVar49.x;
        (pIVar40->RectRel).Min.y = fVar47 - IVar49.y;
        (pIVar40->RectRel).Max.y = (pIVar40->RectRel).Max.y - IVar49.y;
      }
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar22->NavWindow = pIVar40->Window;
      IVar9 = pIVar40->ID;
      if (pIVar22->NavId != IVar9) {
        pIVar22->NavJustMovedToId = IVar9;
        pIVar22->NavJustMovedToFocusScopeId = pIVar40->FocusScopeId;
        pIVar22->NavJustMovedToKeyMods = pIVar22->NavMoveRequestKeyMods;
      }
      pIVar39 = GImGui;
      IVar36 = pIVar22->NavLayer;
      SetNavID(IVar9,IVar36,pIVar40->FocusScopeId);
      IVar49 = (pIVar40->RectRel).Max;
      pIVar8 = &pIVar39->NavWindow->NavRectRel[(int)IVar36].Min;
      *pIVar8 = (pIVar40->RectRel).Min;
      pIVar8[1] = IVar49;
      pIVar39->NavMousePosDirty = true;
    }
    pIVar39->NavDisableHighlight = false;
    pIVar39->NavDisableMouseHover = true;
  }
LAB_0017781e:
  if (pIVar21->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar21->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                    ,0x2295,"void ImGui::NavUpdate()");
    }
    if (((pIVar21->NavMoveResultLocal).ID == 0) && ((pIVar21->NavMoveResultOther).ID == 0)) {
      pIVar21->NavDisableHighlight = false;
    }
    pIVar21->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar21->NavMousePosDirty == true) && (pIVar21->NavIdIsAlive == true)) {
    if (((((pIVar21->IO).ConfigFlags & 4) != 0) &&
        (((((pIVar21->IO).BackendFlags & 4) != 0 && (pIVar21->NavDisableHighlight == false)) &&
         (pIVar21->NavDisableMouseHover == true)))) && (pIVar21->NavWindow != (ImGuiWindow *)0x0)) {
      IVar49 = NavCalcPreferredRefPos();
      (pIVar21->IO).MousePosPrev = IVar49;
      (pIVar21->IO).MousePos = IVar49;
      (pIVar21->IO).WantSetMousePos = true;
    }
    pIVar21->NavMousePosDirty = false;
  }
  pIVar21->NavIdIsAlive = false;
  pIVar21->NavJustTabbedId = 0;
  IVar36 = pIVar21->NavLayer;
  if (ImGuiNavLayer_Menu < IVar36) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x22ab,"void ImGui::NavUpdate()");
  }
  pIVar27 = pIVar21->NavWindow;
  pIVar31 = pIVar27;
  if (pIVar27 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar31->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar31 != pIVar27) {
          pIVar31->NavLastChildNavWindow = pIVar27;
        }
        break;
      }
      ppIVar15 = &pIVar31->ParentWindow;
      pIVar31 = *ppIVar15;
    } while (*ppIVar15 != (ImGuiWindow *)0x0);
    if (((pIVar27 != (ImGuiWindow *)0x0) && (IVar36 == ImGuiNavLayer_Main)) &&
       (pIVar27->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar27->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar22 = GImGui;
  pIVar27 = GetTopMostPopupModal();
  if (pIVar27 != (ImGuiWindow *)0x0) {
    pIVar22->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar22->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar22->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar47 = (pIVar22->IO).DeltaTime * -10.0 + pIVar22->NavWindowingHighlightAlpha;
    fVar47 = (float)(-(uint)(0.0 <= fVar47) & (uint)fVar47);
    pIVar22->NavWindowingHighlightAlpha = fVar47;
    if ((pIVar22->DimBgRatio <= 0.0) && (fVar47 <= 0.0)) {
      pIVar22->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar27 == (ImGuiWindow *)0x0) && (pIVar22->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    bVar24 = (pIVar22->IO).NavInputsDownDuration[3] == 0.0;
  }
  else {
    bVar24 = false;
  }
  if ((((pIVar27 == (ImGuiWindow *)0x0) && (pIVar22->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
      ((pIVar22->IO).KeyCtrl == true)) &&
     ((iVar32 = (pIVar22->IO).KeyMap[0], -1 < iVar32 && (bVar23 = IsKeyPressed(iVar32,true), bVar23)
      ))) {
    bVar41 = (byte)(pIVar22->IO).ConfigFlags & 1;
  }
  else {
    bVar41 = 0;
  }
  if (bVar24 || bVar41 != 0) {
    pIVar27 = pIVar22->NavWindow;
    if (pIVar27 == (ImGuiWindow *)0x0) {
      pIVar27 = FindWindowNavFocusable((pIVar22->WindowsFocusOrder).Size + -1,-0x7fffffff,-1);
    }
    if (pIVar27 != (ImGuiWindow *)0x0) {
      pIVar27 = pIVar27->RootWindow;
      pIVar22->NavWindowingTargetAnim = pIVar27;
      pIVar22->NavWindowingTarget = pIVar27;
      pIVar22->NavWindowingTimer = 0.0;
      pIVar22->NavWindowingHighlightAlpha = 0.0;
      pIVar22->NavWindowingToggleLayer = (bool)(bVar41 ^ 1);
      pIVar22->NavInputSource = ImGuiInputSource_NavGamepad - bVar41;
    }
  }
  fVar47 = (pIVar22->IO).DeltaTime + pIVar22->NavWindowingTimer;
  pIVar22->NavWindowingTimer = fVar47;
  if ((pIVar22->NavWindowingTarget == (ImGuiWindow *)0x0) ||
     (pIVar22->NavInputSource != ImGuiInputSource_NavGamepad)) {
LAB_00177b7c:
    uVar33 = 0;
    pIVar27 = (ImGuiWindow *)0x0;
  }
  else {
    fVar48 = (fVar47 + -0.2) / 0.05;
    fVar47 = 1.0;
    if (fVar48 <= 1.0) {
      fVar47 = fVar48;
    }
    fVar47 = (float)(~-(uint)(fVar48 < 0.0) & (uint)fVar47);
    uVar29 = -(uint)(fVar47 <= pIVar22->NavWindowingHighlightAlpha);
    pIVar22->NavWindowingHighlightAlpha =
         (float)(uVar29 & (uint)pIVar22->NavWindowingHighlightAlpha | ~uVar29 & (uint)fVar47);
    fVar47 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
    fVar48 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
    iVar32 = (uint)(0.0 < fVar47) - (uint)(0.0 < fVar48);
    if (iVar32 != 0) {
      NavUpdateWindowingHighlightWindow(iVar32);
      pIVar22->NavWindowingHighlightAlpha = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) goto LAB_00177b7c;
    pbVar7 = &pIVar22->NavWindowingToggleLayer;
    *pbVar7 = (bool)(*pbVar7 &
                    (pIVar22->NavWindowingHighlightAlpha <= 1.0 &&
                    pIVar22->NavWindowingHighlightAlpha != 1.0));
    if (*pbVar7 == false) {
      pIVar27 = pIVar22->NavWindowingTarget;
      uVar33 = 0;
    }
    else {
      uVar33 = (ulong)CONCAT31((int3)((uint)iVar32 >> 8),pIVar22->NavWindow != (ImGuiWindow *)0x0);
      pIVar27 = (ImGuiWindow *)0x0;
    }
    pIVar22->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar22->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (pIVar22->NavInputSource == ImGuiInputSource_NavKeyboard)) {
    fVar48 = (pIVar22->NavWindowingTimer + -0.2) / 0.05;
    fVar47 = 1.0;
    if (fVar48 <= 1.0) {
      fVar47 = fVar48;
    }
    fVar47 = (float)(~-(uint)(fVar48 < 0.0) & (uint)fVar47);
    uVar29 = -(uint)(fVar47 <= pIVar22->NavWindowingHighlightAlpha);
    pIVar22->NavWindowingHighlightAlpha =
         (float)(uVar29 & (uint)pIVar22->NavWindowingHighlightAlpha | ~uVar29 & (uint)fVar47);
    iVar32 = (GImGui->IO).KeyMap[0];
    if ((-1 < iVar32) && (bVar24 = IsKeyPressed(iVar32,true), bVar24)) {
      NavUpdateWindowingHighlightWindow((pIVar22->IO).KeyShift - 1 | 1);
    }
    if ((pIVar22->IO).KeyCtrl == false) {
      pIVar27 = pIVar22->NavWindowingTarget;
    }
  }
  pIVar39 = GImGui;
  fVar47 = (GImGui->IO).NavInputsDownDuration[0x10];
  if ((fVar47 == 0.0) && (!NAN(fVar47))) {
    pIVar22->NavWindowingToggleLayer = true;
  }
  if ((((pIVar22->ActiveId == 0) || (pIVar22->ActiveIdAllowOverlap == true)) && (fVar47 < 0.0)) &&
     ((pIVar22->NavWindowingToggleLayer != false &&
      (0.0 <= (pIVar39->IO).NavInputsDownDurationPrev[0x10])))) {
    bVar24 = IsMousePosValid(&(pIVar22->IO).MousePos);
    bVar23 = IsMousePosValid(&(pIVar22->IO).MousePosPrev);
    uVar29 = (uint)uVar33;
    uVar33 = 1;
    if (bVar23 != bVar24) {
      uVar33 = (ulong)(uVar29 & 0xff);
    }
  }
  pIVar31 = pIVar22->NavWindowingTarget;
  if ((pIVar31 != (ImGuiWindow *)0x0) && ((pIVar31->Flags & 4) == 0)) {
    IVar10 = pIVar22->NavInputSource;
    IVar49.x = 0.0;
    IVar49.y = 0.0;
    local_38 = uVar33;
    if ((IVar10 == ImGuiInputSource_NavKeyboard) && ((pIVar22->IO).KeyShift == false)) {
      IVar49 = GetNavInputAmount2d(1,ImGuiInputReadMode_Down,0.0,0.0);
    }
    if (IVar10 == ImGuiInputSource_NavGamepad) {
      IVar49 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.0,0.0);
    }
    uVar33 = local_38;
    fVar47 = IVar49.y;
    if (((IVar49.x != 0.0) || (fVar47 != 0.0)) || (NAN(fVar47))) {
      fVar48 = (pIVar22->IO).DisplayFramebufferScale.x;
      fVar56 = (pIVar22->IO).DisplayFramebufferScale.y;
      if (fVar56 <= fVar48) {
        fVar48 = fVar56;
      }
      fVar48 = (float)(int)(fVar48 * (pIVar22->IO).DeltaTime * 800.0);
      pIVar31 = pIVar31->RootWindow;
      local_48.Min.x = IVar49.x * fVar48 + (pIVar31->Pos).x;
      local_48.Min.y = fVar47 * fVar48 + (pIVar31->Pos).y;
      SetWindowPos(pIVar31,&local_48.Min,1);
      if (((pIVar31->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
        GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
      }
      pIVar22->NavDisableMouseHover = true;
    }
  }
  if (pIVar27 != (ImGuiWindow *)0x0) {
    if ((pIVar22->NavWindow == (ImGuiWindow *)0x0) || (pIVar27 != pIVar22->NavWindow->RootWindow)) {
      SetActiveID(0,(ImGuiWindow *)0x0);
      pIVar22->NavDisableHighlight = false;
      pIVar22->NavDisableMouseHover = true;
      pIVar31 = pIVar27->NavLastChildNavWindow;
      if ((pIVar31 == (ImGuiWindow *)0x0) || (pIVar31->WasActive == false)) {
        pIVar31 = pIVar27;
      }
      ClosePopupsOverWindow(pIVar31,false);
      FocusWindow(pIVar31);
      if (pIVar31->NavLastIds[0] == 0) {
        NavInitWindow(pIVar31,false);
      }
      if ((pIVar31->DC).NavLayerActiveMask == 2) {
        pIVar22->NavLayer = ImGuiNavLayer_Menu;
      }
    }
    pIVar22->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if (((char)uVar33 != '\0') &&
     (pIVar27 = pIVar22->NavWindow, pIVar31 = pIVar27, pIVar27 != (ImGuiWindow *)0x0)) {
    while (window = pIVar31, window->ParentWindow != (ImGuiWindow *)0x0) {
      if ((((window->DC).NavLayerActiveMask & 2) != 0) ||
         (pIVar31 = window->ParentWindow, (window->Flags & 0x15000000U) != 0x1000000)) break;
    }
    if (window != pIVar27) {
      FocusWindow(window);
      window->NavLastChildNavWindow = pIVar27;
    }
    pIVar22->NavDisableHighlight = false;
    pIVar22->NavDisableMouseHover = true;
    IVar36 = ImGuiNavLayer_Main;
    if (((pIVar22->NavWindow->DC).NavLayerActiveMask & 2) != 0) {
      IVar36 = pIVar22->NavLayer ^ ImGuiNavLayer_Menu;
    }
    NavRestoreLayer(IVar36);
  }
  if ((((uVar46 & 1) == 0 & (bVar38 ^ 1)) == 0) && (pIVar21->NavWindow != (ImGuiWindow *)0x0)) {
    bVar24 = (pIVar21->NavWindow->Flags & 0x40000U) == 0;
    (pIVar21->IO).NavActive = bVar24;
    if (((!bVar24) || (pIVar21->NavId == 0)) ||
       (bVar24 = true, pIVar21->NavDisableHighlight != false)) goto LAB_00177f3e;
  }
  else {
    (pIVar21->IO).NavActive = false;
LAB_00177f3e:
    bVar24 = pIVar21->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  (pIVar21->IO).NavVisible = bVar24;
  fVar47 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar47 == 0.0) && (!NAN(fVar47))) {
    if (pIVar21->ActiveId == 0) {
      pIVar27 = pIVar21->NavWindow;
      if (((pIVar27 == (ImGuiWindow *)0x0) || ((pIVar27->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar27->ParentWindow == (ImGuiWindow *)0x0)) {
        iVar32 = (pIVar21->OpenPopupStack).Size;
        if ((long)iVar32 < 1) {
          if (pIVar21->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar27 != (ImGuiWindow *)0x0) && ((pIVar27->Flags & 0x5000000U) != 0x1000000)) {
              pIVar27->NavLastIds[0] = 0;
            }
            pIVar21->NavId = 0;
            pIVar21->NavFocusScopeId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else if ((((pIVar21->OpenPopupStack).Data[(long)iVar32 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar32 + -1,true);
        }
      }
      else {
        if (pIVar27->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                        ,0x22c8,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar27->ParentWindow);
        pIVar22 = GImGui;
        pIVar31 = GImGui->NavWindow;
        if (pIVar31 == (ImGuiWindow *)0x0) {
          __assert_fail("g.NavWindow",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                        ,0x20a7,"void ImGui::SetNavID(ImGuiID, int, ImGuiID)");
        }
        IVar9 = pIVar27->ChildId;
        GImGui->NavId = IVar9;
        pIVar22->NavFocusScopeId = 0;
        pIVar31->NavLastIds[0] = IVar9;
        pIVar21->NavIdIsAlive = false;
        if (pIVar21->NavDisableMouseHover == true) {
          pIVar21->NavMousePosDirty = true;
        }
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      SetActiveID(0,(ImGuiWindow *)0x0);
    }
  }
  pIVar21->NavActivateId = 0;
  pIVar21->NavActivateDownId = 0;
  pIVar21->NavActivatePressedId = 0;
  pIVar22 = GImGui;
  pIVar21->NavInputId = 0;
  IVar9 = pIVar21->NavId;
  if ((((IVar9 != 0) && (pIVar21->NavDisableHighlight == false)) &&
      (pIVar21->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
     ((pIVar21->NavWindow != (ImGuiWindow *)0x0 && ((pIVar21->NavWindow->Flags & 0x40000) == 0)))) {
    fVar47 = (GImGui->IO).NavInputs[0];
    if (0.0 < fVar47) {
      bVar24 = (GImGui->IO).NavInputsDownDuration[0] == 0.0;
    }
    else {
      bVar24 = false;
    }
    IVar11 = pIVar21->ActiveId;
    if (bVar24 && IVar11 == 0) {
      pIVar21->NavActivateId = IVar9;
    }
    if (IVar11 == 0) {
      if (0.0 < fVar47) goto LAB_00179a93;
    }
    else if (IVar11 == IVar9 && 0.0 < fVar47) {
LAB_00179a93:
      pIVar21->NavActivateDownId = IVar9;
    }
    if (IVar11 == 0) {
      if (bVar24) goto LAB_00179aa9;
    }
    else if ((bool)(bVar24 & IVar11 == IVar9)) {
LAB_00179aa9:
      pIVar21->NavActivatePressedId = IVar9;
    }
    if (((IVar11 == 0 || IVar11 == IVar9) &&
        (fVar47 = (pIVar22->IO).NavInputsDownDuration[2], fVar47 == 0.0)) && (!NAN(fVar47))) {
      pIVar21->NavInputId = IVar9;
    }
  }
  pIVar27 = pIVar21->NavWindow;
  if ((pIVar27 != (ImGuiWindow *)0x0) && ((pIVar27->Flags & 0x40000) != 0)) {
    pIVar21->NavDisableHighlight = true;
  }
  IVar9 = pIVar21->NavActivateId;
  if ((IVar9 != 0) && (pIVar21->NavActivateDownId != IVar9)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x22f6,"void ImGui::NavUpdate()");
  }
  pIVar21->NavMoveRequest = false;
  IVar9 = pIVar21->NavNextActivateId;
  if (IVar9 != 0) {
    pIVar21->NavInputId = IVar9;
    pIVar21->NavActivatePressedId = IVar9;
    pIVar21->NavActivateDownId = IVar9;
    pIVar21->NavActivateId = IVar9;
  }
  pIVar21->NavNextActivateId = 0;
  if (pIVar21->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar21->NavMoveDir = -1;
    pIVar21->NavMoveRequestFlags = 0;
    if (((pIVar27 != (ImGuiWindow *)0x0) && (pIVar21->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar27->Flags & 0x40000) == 0)) {
      uVar29 = GImGui->ActiveIdUsingNavDirMask;
      if (((uVar29 & 1) == 0) &&
         ((fVar47 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat), 0.0 < fVar47 ||
          (fVar47 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat), 0.0 < fVar47)))) {
        pIVar21->NavMoveDir = 0;
      }
      if (((uVar29 & 2) == 0) &&
         ((fVar47 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat), 0.0 < fVar47 ||
          (fVar47 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat), 0.0 < fVar47)))) {
        pIVar21->NavMoveDir = 1;
      }
      if (((uVar29 & 4) == 0) &&
         ((fVar47 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat), 0.0 < fVar47 ||
          (fVar47 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat), 0.0 < fVar47)))) {
        pIVar21->NavMoveDir = 2;
      }
      if (((uVar29 & 8) == 0) &&
         ((fVar47 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat), 0.0 < fVar47 ||
          (fVar47 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat), 0.0 < fVar47)))) {
        pIVar21->NavMoveDir = 3;
      }
    }
    pIVar21->NavMoveClipDir = pIVar21->NavMoveDir;
  }
  else {
    if ((pIVar21->NavMoveDir == -1) || (pIVar21->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                    ,0x2311,"void ImGui::NavUpdate()");
    }
    if (pIVar21->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                    ,0x2312,"void ImGui::NavUpdate()");
    }
    pIVar21->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar22 = GImGui;
  fVar47 = 0.0;
  if (((((uVar46 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
      (pIVar27 = GImGui->NavWindow, pIVar27 != (ImGuiWindow *)0x0)) &&
     ((((pIVar27->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
      (GImGui->NavLayer == ImGuiNavLayer_Main)))) {
    bVar24 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar23 = false;
    bVar45 = false;
    if (bVar24) {
      bVar45 = (GImGui->ActiveIdUsingKeyInputMask & 0x20) == 0;
    }
    bVar24 = IsKeyDown((pIVar22->IO).KeyMap[6]);
    if (bVar24) {
      bVar23 = (GImGui->ActiveIdUsingKeyInputMask & 0x40) == 0;
    }
    bVar24 = IsKeyPressed((pIVar22->IO).KeyMap[7],true);
    if (bVar24) {
      bVar24 = (GImGui->ActiveIdUsingKeyInputMask & 0x80) == 0;
    }
    else {
      bVar24 = false;
    }
    bVar25 = IsKeyPressed((pIVar22->IO).KeyMap[8],true);
    if (bVar25) {
      bVar25 = (GImGui->ActiveIdUsingKeyInputMask & 0x100) == 0;
    }
    else {
      bVar25 = false;
    }
    fVar47 = 0.0;
    if ((bVar45 != bVar23) || (bVar24 != bVar25)) {
      if (((pIVar27->DC).NavLayerActiveMask == 0) && ((pIVar27->DC).NavHasScroll == true)) {
        bVar23 = IsKeyPressed((pIVar22->IO).KeyMap[5],true);
        if (bVar23) {
          fVar47 = (pIVar27->Scroll).y - ((pIVar27->InnerRect).Max.y - (pIVar27->InnerRect).Min.y);
LAB_00179d5c:
          (pIVar27->ScrollTarget).y = fVar47;
        }
        else {
          bVar23 = IsKeyPressed((pIVar22->IO).KeyMap[6],true);
          if (bVar23) {
            fVar47 = ((pIVar27->InnerRect).Max.y - (pIVar27->InnerRect).Min.y) + (pIVar27->Scroll).y
            ;
            goto LAB_00179d5c;
          }
          if (bVar24 == false) {
            if (bVar25 == false) goto LAB_00179d6f;
            fVar47 = (pIVar27->ScrollMax).y;
            goto LAB_00179d5c;
          }
          (pIVar27->ScrollTarget).y = 0.0;
        }
        (pIVar27->ScrollTargetCenterRatio).y = 0.0;
        (pIVar27->ScrollTargetEdgeSnapDist).y = 0.0;
LAB_00179d6f:
        fVar47 = 0.0;
      }
      else {
        IVar36 = pIVar22->NavLayer;
        pIVar34 = pIVar27->NavRectRel + IVar36;
        fVar47 = GImGui->FontBaseSize * pIVar27->FontWindowScale;
        if (pIVar27->ParentWindow != (ImGuiWindow *)0x0) {
          fVar47 = fVar47 * pIVar27->ParentWindow->FontWindowScale;
        }
        fVar47 = (pIVar27->NavRectRel[IVar36].Max.y - pIVar27->NavRectRel[IVar36].Min.y) +
                 (((pIVar27->InnerRect).Max.y - (pIVar27->InnerRect).Min.y) - fVar47);
        fVar47 = (float)(~-(uint)(fVar47 <= 0.0) & (uint)fVar47);
        bVar23 = IsKeyPressed((pIVar22->IO).KeyMap[5],true);
        if (bVar23) {
          fVar47 = -fVar47;
          pIVar22->NavMoveDir = 3;
          pIVar22->NavMoveClipDir = 2;
          pIVar22->NavMoveRequestFlags = 0x30;
        }
        else {
          bVar23 = IsKeyPressed((pIVar22->IO).KeyMap[6],true);
          if (!bVar23) {
            if (bVar24 == false) {
              fVar47 = 0.0;
              if (bVar25 != false) {
                fVar48 = ((pIVar27->ScrollMax).y + (pIVar27->SizeFull).y) - (pIVar27->Scroll).y;
                pIVar27->NavRectRel[IVar36].Max.y = fVar48;
                pIVar27->NavRectRel[IVar36].Min.y = fVar48;
                fVar48 = (pIVar34->Min).x;
                pIVar8 = &pIVar27->NavRectRel[IVar36].Max;
                if (pIVar8->x <= fVar48 && fVar48 != pIVar8->x) {
                  pIVar27->NavRectRel[IVar36].Max.x = 0.0;
                  (pIVar34->Min).x = 0.0;
                }
                pIVar22->NavMoveDir = 2;
                pIVar22->NavMoveRequestFlags = 0x50;
              }
              goto LAB_00178369;
            }
            fVar47 = -(pIVar27->Scroll).y;
            pIVar27->NavRectRel[IVar36].Max.y = fVar47;
            pIVar27->NavRectRel[IVar36].Min.y = fVar47;
            fVar47 = (pIVar34->Min).x;
            pIVar8 = &pIVar27->NavRectRel[IVar36].Max;
            if (pIVar8->x <= fVar47 && fVar47 != pIVar8->x) {
              pIVar27->NavRectRel[IVar36].Max.x = 0.0;
              (pIVar34->Min).x = 0.0;
            }
            pIVar22->NavMoveDir = 3;
            pIVar22->NavMoveRequestFlags = 0x50;
            goto LAB_00179d6f;
          }
          pIVar22->NavMoveDir = 2;
          pIVar22->NavMoveClipDir = 3;
          pIVar22->NavMoveRequestFlags = 0x30;
        }
      }
    }
  }
LAB_00178369:
  uVar46 = pIVar21->NavMoveDir;
  if (uVar46 != 0xffffffff) {
    pIVar21->NavMoveRequest = true;
    pIVar21->NavMoveRequestKeyMods = (pIVar21->IO).KeyMods;
    pIVar21->NavMoveDirLast = uVar46;
  }
  bVar24 = pIVar21->NavMoveRequest;
  if ((bVar24 == true) && (pIVar21->NavId == 0)) {
    pIVar21->NavInitRequest = true;
    pIVar21->NavInitRequestFromMove = true;
    pIVar21->NavInitResultId = 0;
    pIVar21->NavDisableHighlight = false;
  }
  pIVar22 = GImGui;
  if (GImGui->NavMoveRequest == false) {
    pbVar7 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar7;
    if (*pbVar7 != false) goto LAB_001783f3;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_001783f3:
    if (pIVar22->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                    ,0x2201,"void ImGui::NavUpdateAnyRequestFlag()");
    }
  }
  pIVar27 = pIVar21->NavWindow;
  if (((pIVar27 != (ImGuiWindow *)0x0) && ((pIVar27->Flags & 0x40000) == 0)) &&
     (pIVar21->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar48 = pIVar22->FontBaseSize * pIVar27->FontWindowScale;
    if (pIVar27->ParentWindow != (ImGuiWindow *)0x0) {
      fVar48 = fVar48 * pIVar27->ParentWindow->FontWindowScale;
    }
    fVar48 = (float)(int)(fVar48 * 100.0 * (pIVar21->IO).DeltaTime + 0.5);
    if (((pIVar27->DC).NavLayerActiveMask == 0) && (((pIVar27->DC).NavHasScroll & bVar24) == 1)) {
      if (uVar46 < 2) {
        (pIVar27->ScrollTarget).x =
             (float)(int)(*(float *)(&DAT_001bdbac + (ulong)(uVar46 == 0) * 4) * fVar48 +
                         (pIVar27->Scroll).x);
        (pIVar27->ScrollTargetCenterRatio).x = 0.0;
        (pIVar27->ScrollTargetEdgeSnapDist).x = 0.0;
      }
      if ((uVar46 & 0xfffffffe) == 2) {
        (pIVar27->ScrollTarget).y =
             (float)(int)(*(float *)(&DAT_001bdbac + (ulong)(uVar46 == 2) * 4) * fVar48 +
                         (pIVar27->Scroll).y);
        (pIVar27->ScrollTargetCenterRatio).y = 0.0;
        (pIVar27->ScrollTargetEdgeSnapDist).y = 0.0;
      }
    }
    IVar49 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar56 = IVar49.x;
    fVar58 = IVar49.y;
    if (((fVar56 != 0.0) || (NAN(fVar56))) && (pIVar27->ScrollbarX == true)) {
      (pIVar27->ScrollTarget).x = (float)(int)(fVar56 * fVar48 + (pIVar27->Scroll).x);
      (pIVar27->ScrollTargetCenterRatio).x = 0.0;
      (pIVar27->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    if ((fVar58 != 0.0) || (NAN(fVar58))) {
      (pIVar27->ScrollTarget).y = (float)(int)(fVar58 * fVar48 + (pIVar27->Scroll).y);
      (pIVar27->ScrollTargetCenterRatio).y = 0.0;
      (pIVar27->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  (pIVar21->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar21->NavMoveResultLocal).ID = 0;
  (pIVar21->NavMoveResultLocal).FocusScopeId = 0;
  (pIVar21->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar21->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar21->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar21->NavMoveResultLocal).RectRel.Min.x = 0.0;
  (pIVar21->NavMoveResultLocal).RectRel.Min.y = 0.0;
  (pIVar21->NavMoveResultLocal).RectRel.Max.x = 0.0;
  (pIVar21->NavMoveResultLocal).RectRel.Max.y = 0.0;
  (pIVar21->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar21->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar21->NavMoveResultLocalVisibleSet).FocusScopeId = 0;
  (pIVar21->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar21->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar21->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar21->NavMoveResultLocalVisibleSet).RectRel.Min.x = 0.0;
  (pIVar21->NavMoveResultLocalVisibleSet).RectRel.Min.y = 0.0;
  (pIVar21->NavMoveResultLocalVisibleSet).RectRel.Max.x = 0.0;
  (pIVar21->NavMoveResultLocalVisibleSet).RectRel.Max.y = 0.0;
  (pIVar21->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar21->NavMoveResultOther).ID = 0;
  (pIVar21->NavMoveResultOther).FocusScopeId = 0;
  (pIVar21->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar21->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar21->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar21->NavMoveResultOther).RectRel.Min.x = 0.0;
  (pIVar21->NavMoveResultOther).RectRel.Min.y = 0.0;
  (pIVar21->NavMoveResultOther).RectRel.Max.x = 0.0;
  (pIVar21->NavMoveResultOther).RectRel.Max.y = 0.0;
  if (((bVar24 != false) && (pIVar21->NavInputSource == ImGuiInputSource_NavGamepad)) &&
     (pIVar21->NavLayer == ImGuiNavLayer_Main)) {
    fVar48 = (pIVar27->Pos).x;
    fVar56 = (pIVar27->Pos).y;
    local_48.Min.x = ((pIVar27->InnerRect).Min.x - fVar48) + -1.0;
    fVar58 = ((pIVar27->InnerRect).Min.y - fVar56) + -1.0;
    local_48.Min.y = fVar58;
    fVar59 = ((pIVar27->InnerRect).Max.x - fVar48) + 1.0;
    fVar48 = ((pIVar27->InnerRect).Max.y - fVar56) + 1.0;
    local_48.Max.y = fVar48;
    local_48.Max.x = fVar59;
    if (((pIVar27->NavRectRel[0].Min.x < local_48.Min.x) || (pIVar27->NavRectRel[0].Min.y < fVar58))
       || ((fVar59 < pIVar27->NavRectRel[0].Max.x || (fVar48 < pIVar27->NavRectRel[0].Max.y)))) {
      fVar56 = pIVar22->FontBaseSize * pIVar27->FontWindowScale;
      if (pIVar27->ParentWindow != (ImGuiWindow *)0x0) {
        fVar56 = fVar56 * pIVar27->ParentWindow->FontWindowScale;
      }
      fVar56 = fVar56 * 0.5;
      fVar19 = fVar59 - local_48.Min.x;
      if (fVar56 <= fVar59 - local_48.Min.x) {
        fVar19 = fVar56;
      }
      fVar60 = fVar48 - fVar58;
      if (fVar56 <= fVar48 - fVar58) {
        fVar60 = fVar56;
      }
      local_48.Min.y = fVar58 + fVar60;
      local_48.Min.x = local_48.Min.x + fVar19;
      local_48.Max.y = fVar48 - fVar60;
      local_48.Max.x = fVar59 - fVar19;
      ImRect::ClipWithFull(pIVar27->NavRectRel,&local_48);
      pIVar21->NavId = 0;
      pIVar21->NavFocusScopeId = 0;
    }
  }
  pIVar27 = pIVar21->NavWindow;
  if (pIVar27 == (ImGuiWindow *)0x0) {
    fVar48 = (GImGui->IO).DisplaySize.x;
    fVar56 = (GImGui->IO).DisplaySize.y;
    IVar50.x = 0.0;
    IVar50.y = 0.0;
  }
  else {
    IVar36 = pIVar21->NavLayer;
    fVar48 = (pIVar27->Pos).x;
    fVar56 = (pIVar27->Pos).y;
    IVar50.x = pIVar27->NavRectRel[IVar36].Min.x + fVar48;
    IVar50.y = pIVar27->NavRectRel[IVar36].Min.y + fVar56;
    fVar48 = pIVar27->NavRectRel[IVar36].Max.x + fVar48;
    fVar56 = pIVar27->NavRectRel[IVar36].Max.y + fVar56;
  }
  IVar57.y = fVar56;
  IVar57.x = fVar48;
  (pIVar21->NavScoringRect).Min = IVar50;
  (pIVar21->NavScoringRect).Max = IVar57;
  fVar58 = (pIVar21->NavScoringRect).Min.y + fVar47;
  (pIVar21->NavScoringRect).Min.y = fVar58;
  fVar47 = fVar47 + (pIVar21->NavScoringRect).Max.y;
  (pIVar21->NavScoringRect).Max.y = fVar47;
  fVar56 = (pIVar21->NavScoringRect).Min.x + 1.0;
  fVar48 = (pIVar21->NavScoringRect).Max.x;
  if (fVar48 <= fVar56) {
    fVar56 = fVar48;
  }
  (pIVar21->NavScoringRect).Min.x = fVar56;
  (pIVar21->NavScoringRect).Max.x = fVar56;
  if (fVar47 < fVar58) {
    __assert_fail("!g.NavScoringRect.IsInverted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0x2361,"void ImGui::NavUpdate()");
  }
  pIVar21->NavScoringCount = 0;
  pIVar21 = GImGui;
  pIVar8 = &(GImGui->IO).MousePos;
  bVar24 = IsMousePosValid(pIVar8);
  if (bVar24) {
    IVar51.x = (float)(int)(pIVar21->IO).MousePos.x;
    IVar51.y = (float)(int)(pIVar21->IO).MousePos.y;
    pIVar21->LastValidMousePos = IVar51;
    (pIVar21->IO).MousePos = IVar51;
  }
  bVar24 = IsMousePosValid(pIVar8);
  if ((bVar24) && (bVar24 = IsMousePosValid(&(pIVar21->IO).MousePosPrev), bVar24)) {
    IVar52.x = (pIVar21->IO).MousePos.x - (pIVar21->IO).MousePosPrev.x;
    IVar52.y = (pIVar21->IO).MousePos.y - (pIVar21->IO).MousePosPrev.y;
    (pIVar21->IO).MouseDelta = IVar52;
  }
  else {
    (pIVar21->IO).MouseDelta.x = 0.0;
    (pIVar21->IO).MouseDelta.y = 0.0;
  }
  if ((((pIVar21->IO).MouseDelta.x != 0.0) || (fVar47 = (pIVar21->IO).MouseDelta.y, fVar47 != 0.0))
     || (NAN(fVar47))) {
    pIVar21->NavDisableMouseHover = false;
  }
  (pIVar21->IO).MousePosPrev = (pIVar21->IO).MousePos;
  lVar42 = -5;
  do {
    fVar47 = -1.0;
    bVar24 = (pIVar21->IO).MouseDown[lVar42 + 5];
    if (bVar24 == true) {
      pfVar3 = (pIVar21->IO).MouseDownDurationPrev + lVar42;
      bVar23 = *pfVar3 <= 0.0 && *pfVar3 != 0.0;
    }
    else {
      bVar23 = false;
    }
    (pIVar21->IO).MouseDoubleClicked[lVar42] = bVar23;
    if (bVar24 == false) {
      bVar45 = 0.0 <= (pIVar21->IO).MouseDownDurationPrev[lVar42];
    }
    else {
      bVar45 = false;
    }
    (pIVar21->IO).MouseDownOwned[lVar42] = bVar45;
    fVar48 = (pIVar21->IO).MouseDownDurationPrev[lVar42];
    (&(pIVar21->IO).MouseDragMaxDistanceAbs[0].x)[lVar42] = fVar48;
    if ((bVar24 != false) && (fVar47 = 0.0, 0.0 <= fVar48)) {
      fVar47 = fVar48 + (pIVar21->IO).DeltaTime;
    }
    (pIVar21->IO).MouseDownDurationPrev[lVar42] = fVar47;
    (pIVar21->IO).MouseReleased[lVar42] = false;
    if (bVar23 == false) {
      if (bVar24 != false) {
        bVar24 = IsMousePosValid(pIVar8);
        fVar47 = 0.0;
        fVar48 = 0.0;
        if (bVar24) {
          fVar47 = (pIVar21->IO).MousePos.x -
                   *(float *)((long)(pIVar21->IO).MouseClickedTime + lVar42 * 8 + -4);
          fVar48 = (pIVar21->IO).MousePos.y - *(float *)((pIVar21->IO).MouseClickedTime + lVar42);
        }
        fVar56 = (pIVar21->IO).KeysDownDuration[lVar42];
        fVar58 = -fVar48;
        if (-fVar48 <= fVar48) {
          fVar58 = fVar48;
        }
        fVar48 = fVar47 * fVar47 + fVar48 * fVar48;
        uVar46 = -(uint)(fVar48 <= fVar56);
        (pIVar21->IO).KeysDownDuration[lVar42] =
             (float)(~uVar46 & (uint)fVar48 | (uint)fVar56 & uVar46);
        fVar48 = -fVar47;
        if (-fVar47 <= fVar47) {
          fVar48 = fVar47;
        }
        fVar47 = (pIVar21->IO).MouseDragMaxDistanceSqr[lVar42 * 2];
        fVar56 = (pIVar21->IO).MouseDragMaxDistanceSqr[lVar42 * 2 + 1];
        uVar46 = -(uint)(fVar48 <= fVar47);
        (pIVar21->IO).MouseDragMaxDistanceSqr[lVar42 * 2] =
             (float)(~uVar46 & (uint)fVar48 | (uint)fVar47 & uVar46);
        uVar46 = -(uint)(fVar58 <= fVar56);
        (pIVar21->IO).MouseDragMaxDistanceSqr[lVar42 * 2 + 1] =
             (float)(~uVar46 & (uint)fVar58 | (uint)fVar56 & uVar46);
      }
    }
    else {
      dVar53 = pIVar21->Time;
      if ((float)(dVar53 - *(double *)((pIVar21->IO).MouseClicked + lVar42 * 8)) <
          (pIVar21->IO).MouseDoubleClickTime) {
        bVar24 = IsMousePosValid(pIVar8);
        fVar47 = 0.0;
        fVar48 = 0.0;
        if (bVar24) {
          fVar47 = (pIVar21->IO).MousePos.x -
                   *(float *)((long)(pIVar21->IO).MouseClickedTime + lVar42 * 8 + -4);
          fVar48 = (pIVar21->IO).MousePos.y - *(float *)((pIVar21->IO).MouseClickedTime + lVar42);
        }
        fVar56 = (pIVar21->IO).MouseDoubleClickMaxDist;
        if (fVar47 * fVar47 + fVar48 * fVar48 < fVar56 * fVar56) {
          (pIVar21->IO).MouseReleased[lVar42] = true;
        }
        dVar53 = (double)((pIVar21->IO).MouseDoubleClickTime * -2.0);
      }
      *(double *)((pIVar21->IO).MouseClicked + lVar42 * 8) = dVar53;
      *(ImVec2 *)((long)(pIVar21->IO).MouseClickedTime + lVar42 * 8 + -4) = (pIVar21->IO).MousePos;
      *(bool *)((long)(pIVar21->IO).MouseDownDuration + lVar42 + -3) =
           (pIVar21->IO).MouseReleased[lVar42];
      pfVar3 = (pIVar21->IO).MouseDragMaxDistanceSqr + lVar42 * 2;
      pfVar3[0] = 0.0;
      pfVar3[1] = 0.0;
      (pIVar21->IO).KeysDownDuration[lVar42] = 0.0;
    }
    if (((pIVar21->IO).MouseDown[lVar42 + 5] == false) &&
       ((pIVar21->IO).MouseDownOwned[lVar42] == false)) {
      *(undefined1 *)((long)(pIVar21->IO).MouseDownDuration + lVar42 + -3) = 0;
    }
    if ((pIVar21->IO).MouseDoubleClicked[lVar42] == true) {
      pIVar21->NavDisableMouseHover = false;
    }
    lVar42 = lVar42 + 1;
  } while (lVar42 != 0);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar27 = GetTopMostPopupModal();
  if ((pIVar27 != (ImGuiWindow *)0x0) ||
     ((pIVar20->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar20->NavWindowingHighlightAlpha)))) {
    fVar47 = (pIVar20->IO).DeltaTime * 6.0 + pIVar20->DimBgRatio;
    if (1.0 <= fVar47) {
      fVar47 = 1.0;
    }
    pIVar20->DimBgRatio = fVar47;
  }
  else {
    fVar47 = (pIVar20->IO).DeltaTime * -10.0 + pIVar20->DimBgRatio;
    pIVar20->DimBgRatio = (float)(-(uint)(0.0 <= fVar47) & (uint)fVar47);
  }
  pIVar20->MouseCursor = 0;
  pIVar20->WantTextInputNextFrame = -1;
  pIVar20->WantCaptureMouseNextFrame = -1;
  pIVar20->WantCaptureKeyboardNextFrame = -1;
  (pIVar20->PlatformImePos).x = 1.0;
  pIVar21 = GImGui;
  (pIVar20->PlatformImePos).y = 1.0;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar24 = IsMousePosValid((ImVec2 *)0x0);
    if ((bVar24) &&
       (fVar47 = (pIVar21->IO).MouseDragThreshold,
       fVar48 = (pIVar21->IO).MousePos.x - (pIVar21->WheelingWindowRefMousePos).x,
       fVar56 = (pIVar21->IO).MousePos.y - (pIVar21->WheelingWindowRefMousePos).y,
       fVar47 * fVar47 < fVar48 * fVar48 + fVar56 * fVar56)) {
      pIVar21->WheelingWindowTimer = 0.0;
    }
    if (pIVar21->WheelingWindowTimer <= 0.0) {
      pIVar21->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar21->WheelingWindowTimer = 0.0;
    }
  }
  pIVar22 = GImGui;
  fVar47 = (pIVar21->IO).MouseWheel;
  if (((((fVar47 != 0.0) || (fVar48 = (pIVar21->IO).MouseWheelH, fVar48 != 0.0)) || (NAN(fVar48)))
      && ((pIVar21->ActiveId == 0 || (pIVar21->ActiveIdUsingMouseWheel == false)))) &&
     ((pIVar21->HoveredIdPreviousFrame == 0 ||
      (pIVar21->HoveredIdPreviousFrameUsingMouseWheel == false)))) {
    pIVar27 = pIVar21->WheelingWindow;
    if (pIVar27 == (ImGuiWindow *)0x0) {
      pIVar27 = pIVar21->HoveredWindow;
    }
    if ((pIVar27 != (ImGuiWindow *)0x0) && (pIVar27->Collapsed == false)) {
      fVar48 = 0.0;
      if ((fVar47 != 0.0) || (NAN(fVar47))) {
        if (((pIVar21->IO).KeyCtrl == true) && ((pIVar21->IO).FontAllowUserScaling == true)) {
          if (GImGui->WheelingWindow != pIVar27) {
            GImGui->WheelingWindow = pIVar27;
            pIVar22->WheelingWindowRefMousePos = (pIVar22->IO).MousePos;
            pIVar22->WheelingWindowTimer = 2.0;
          }
          fVar47 = pIVar27->FontWindowScale;
          fVar56 = (pIVar21->IO).MouseWheel * 0.1 + fVar47;
          fVar48 = 2.5;
          if (fVar56 <= 2.5) {
            fVar48 = fVar56;
          }
          fVar48 = (float)(-(uint)(fVar56 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar56 < 0.5) & (uint)fVar48);
          pIVar27->FontWindowScale = fVar48;
          if ((pIVar27->Flags & 0x1000000) == 0) {
            fVar48 = fVar48 / fVar47;
            fVar47 = (pIVar27->Size).x;
            fVar56 = (pIVar27->Size).y;
            fVar58 = (pIVar27->Pos).x;
            fVar59 = (pIVar27->Pos).y;
            local_48.Min.y =
                 (((pIVar21->IO).MousePos.y - fVar59) * (1.0 - fVar48) * fVar56) / fVar56 + fVar59;
            local_48.Min.x =
                 (((pIVar21->IO).MousePos.x - fVar58) * (1.0 - fVar48) * fVar47) / fVar47 + fVar58;
            SetWindowPos(pIVar27,&local_48.Min,0);
            IVar54.x = (float)(int)((pIVar27->Size).x * fVar48);
            IVar54.y = (float)(int)((pIVar27->Size).y * fVar48);
            pIVar27->Size = IVar54;
            IVar55.x = (float)(int)((pIVar27->SizeFull).x * fVar48);
            IVar55.y = (float)(int)(fVar48 * (pIVar27->SizeFull).y);
            pIVar27->SizeFull = IVar55;
          }
          goto LAB_001792a0;
        }
        if ((pIVar21->IO).KeyShift == false) {
          fVar48 = fVar47;
        }
      }
      if (((fVar48 != 0.0) || (NAN(fVar48))) && ((pIVar21->IO).KeyCtrl == false)) {
        if (GImGui->WheelingWindow != pIVar27) {
          GImGui->WheelingWindow = pIVar27;
          pIVar22->WheelingWindowRefMousePos = (pIVar22->IO).MousePos;
          pIVar22->WheelingWindowTimer = 2.0;
        }
        uVar46 = pIVar27->Flags;
        while (((uVar46 >> 0x18 & 1) != 0 &&
               (((uVar46 & 0x210) == 0x10 ||
                ((fVar47 = (pIVar27->ScrollMax).y, fVar47 == 0.0 && (!NAN(fVar47)))))))) {
          pIVar27 = pIVar27->ParentWindow;
          uVar46 = pIVar27->Flags;
        }
        if ((uVar46 & 0x210) == 0) {
          fVar47 = ((pIVar27->InnerRect).Max.y - (pIVar27->InnerRect).Min.y) * 0.67;
          fVar56 = pIVar22->FontBaseSize * pIVar27->FontWindowScale;
          if (pIVar27->ParentWindow != (ImGuiWindow *)0x0) {
            fVar56 = fVar56 * pIVar27->ParentWindow->FontWindowScale;
          }
          fVar58 = fVar56 * 5.0;
          if (fVar47 <= fVar56 * 5.0) {
            fVar58 = fVar47;
          }
          (pIVar27->ScrollTarget).y = (pIVar27->Scroll).y - fVar48 * (float)(int)fVar58;
          (pIVar27->ScrollTargetCenterRatio).y = 0.0;
          (pIVar27->ScrollTargetEdgeSnapDist).y = 0.0;
        }
      }
      pIVar22 = GImGui;
      fVar47 = (pIVar21->IO).MouseWheelH;
      if (((fVar47 == 0.0) && (!NAN(fVar47))) || ((pIVar21->IO).KeyShift == true)) {
        fVar48 = (pIVar21->IO).MouseWheel;
        if ((fVar48 != 0.0) || (NAN(fVar48))) {
          fVar47 = 0.0;
          if ((pIVar21->IO).KeyShift == true) {
            fVar47 = fVar48;
          }
        }
        else {
          fVar47 = 0.0;
        }
      }
      if (((fVar47 != 0.0) || (NAN(fVar47))) && ((pIVar21->IO).KeyCtrl == false)) {
        if (GImGui->WheelingWindow != pIVar27) {
          GImGui->WheelingWindow = pIVar27;
          pIVar22->WheelingWindowRefMousePos = (pIVar22->IO).MousePos;
          pIVar22->WheelingWindowTimer = 2.0;
        }
        while ((uVar46 = pIVar27->Flags, (uVar46 >> 0x18 & 1) != 0 &&
               (((uVar46 & 0x210) == 0x10 ||
                ((fVar48 = (pIVar27->ScrollMax).x, fVar48 == 0.0 && (!NAN(fVar48)))))))) {
          pIVar27 = pIVar27->ParentWindow;
        }
        if ((uVar46 & 0x210) == 0) {
          fVar48 = ((pIVar27->InnerRect).Max.x - (pIVar27->InnerRect).Min.x) * 0.67;
          fVar56 = pIVar22->FontBaseSize * pIVar27->FontWindowScale;
          if (pIVar27->ParentWindow != (ImGuiWindow *)0x0) {
            fVar56 = fVar56 * pIVar27->ParentWindow->FontWindowScale;
          }
          fVar58 = fVar56 + fVar56;
          if (fVar48 <= fVar56 + fVar56) {
            fVar58 = fVar48;
          }
          (pIVar27->ScrollTarget).x = (pIVar27->Scroll).x - fVar47 * (float)(int)fVar58;
          (pIVar27->ScrollTargetCenterRatio).x = 0.0;
          (pIVar27->ScrollTargetEdgeSnapDist).x = 0.0;
        }
      }
    }
  }
LAB_001792a0:
  pIVar21 = GImGui;
  pIVar27 = GImGui->NavWindow;
  if (((pIVar27 == (ImGuiWindow *)0x0) || (pIVar27->Active != true)) ||
     (((pIVar27->Flags & 0x40000) != 0 ||
      (((GImGui->IO).KeyCtrl != false || (iVar32 = (GImGui->IO).KeyMap[0], iVar32 < 0)))))) {
    bVar24 = false;
  }
  else {
    bVar24 = IsKeyPressed(iVar32,true);
  }
  pIVar21->FocusTabPressed = bVar24;
  if ((bVar24 != false) && (pIVar21->ActiveId == 0)) {
    pIVar21->FocusRequestNextWindow = pIVar21->NavWindow;
    pIVar21->FocusRequestNextCounterRegular = 0x7fffffff;
    if ((pIVar21->NavId == 0) || (pIVar21->NavIdTabCounter == 0x7fffffff)) {
      iVar32 = -(uint)(pIVar21->IO).KeyShift;
    }
    else {
      iVar32 = pIVar21->NavIdTabCounter + (-(uint)(pIVar21->IO).KeyShift | 1) + 1;
    }
    pIVar21->FocusRequestNextCounterTabStop = iVar32;
  }
  pIVar21->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar21->FocusRequestCurrCounterRegular = 0x7fffffff;
  pIVar21->FocusRequestCurrCounterTabStop = 0x7fffffff;
  pIVar27 = pIVar21->FocusRequestNextWindow;
  if (pIVar27 != (ImGuiWindow *)0x0) {
    pIVar21->FocusRequestCurrWindow = pIVar27;
    if ((pIVar21->FocusRequestNextCounterRegular != 0x7fffffff) &&
       (iVar32 = (pIVar27->DC).FocusCounterRegular, iVar32 != -1)) {
      pIVar21->FocusRequestCurrCounterRegular =
           (pIVar21->FocusRequestNextCounterRegular + iVar32 + 1) % (iVar32 + 1);
    }
    if ((pIVar21->FocusRequestNextCounterTabStop != 0x7fffffff) &&
       (iVar32 = (pIVar27->DC).FocusCounterTabStop, iVar32 != -1)) {
      pIVar21->FocusRequestCurrCounterTabStop =
           (pIVar21->FocusRequestNextCounterTabStop + iVar32 + 1) % (iVar32 + 1);
    }
    pIVar21->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar21->FocusRequestNextCounterRegular = 0x7fffffff;
    pIVar21->FocusRequestNextCounterTabStop = 0x7fffffff;
  }
  pIVar21->NavIdTabCounter = 0x7fffffff;
  if ((pIVar20->WindowsFocusOrder).Size != (pIVar20->Windows).Size) {
    __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                  ,0xf50,"void ImGui::NewFrame()");
  }
  fVar47 = 3.4028235e+38;
  if ((pIVar20->GcCompactAll == false) &&
     (fVar48 = (pIVar20->IO).ConfigMemoryCompactTimer, 0.0 <= fVar48)) {
    fVar47 = (float)pIVar20->Time - fVar48;
  }
  uVar46 = (pIVar20->Windows).Size;
  uVar33 = (ulong)uVar46;
  if (uVar46 != 0) {
    uVar44 = 0;
    do {
      if ((long)(int)uVar33 <= (long)uVar44) {
        pcVar30 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_00179dde;
      }
      pIVar27 = (pIVar20->Windows).Data[uVar44];
      bVar24 = pIVar27->Active;
      pIVar27->WasActive = bVar24;
      pIVar27->BeginCount = 0;
      pIVar27->Active = false;
      pIVar27->WriteAccessed = false;
      if (((bVar24 == false) && (pIVar27->MemoryCompacted == false)) &&
         (pIVar27->LastTimeActive <= fVar47 && fVar47 != pIVar27->LastTimeActive)) {
        GcCompactTransientWindowBuffers(pIVar27);
      }
      uVar44 = uVar44 + 1;
      uVar33 = (ulong)(uint)(pIVar20->Windows).Size;
    } while (uVar44 != uVar33);
  }
  if (0 < (pIVar20->TablesLastTimeActive).Size) {
    lVar42 = 0;
    lVar43 = 0;
    do {
      fVar48 = (pIVar20->TablesLastTimeActive).Data[lVar43];
      if ((0.0 <= fVar48) && (fVar48 < fVar47)) {
        if ((pIVar20->Tables).Buf.Size <= lVar43) {
          pcVar30 = "T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]";
          goto LAB_00179dde;
        }
        TableGcCompactTransientBuffers
                  ((ImGuiTable *)((long)&((pIVar20->Tables).Buf.Data)->ID + lVar42));
      }
      lVar43 = lVar43 + 1;
      lVar42 = lVar42 + 0x250;
    } while (lVar43 < (pIVar20->TablesLastTimeActive).Size);
  }
  if (pIVar20->GcCompactAll != false) {
    GcCompactTransientMiscBuffers();
  }
  pIVar20->GcCompactAll = false;
  if ((pIVar20->NavWindow != (ImGuiWindow *)0x0) && (pIVar20->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  iVar32 = (pIVar20->CurrentWindowStack).Capacity;
  if (iVar32 < 0) {
    uVar46 = iVar32 / 2 + iVar32;
    uVar33 = 0;
    if (0 < (int)uVar46) {
      uVar33 = (ulong)uVar46;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar17 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar17 = *piVar17 + 1;
    }
    __dest_00 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar33 * 8,GImAllocatorUserData);
    ppIVar15 = (pIVar20->CurrentWindowStack).Data;
    if (ppIVar15 != (ImGuiWindow **)0x0) {
      memcpy(__dest_00,ppIVar15,(long)(pIVar20->CurrentWindowStack).Size << 3);
      ppIVar15 = (pIVar20->CurrentWindowStack).Data;
      if ((ppIVar15 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar17 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar17 = *piVar17 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar15,GImAllocatorUserData);
    }
    (pIVar20->CurrentWindowStack).Data = __dest_00;
    (pIVar20->CurrentWindowStack).Capacity = (int)uVar33;
  }
  (pIVar20->CurrentWindowStack).Size = 0;
  iVar32 = (pIVar20->BeginPopupStack).Capacity;
  if (iVar32 < 0) {
    uVar46 = iVar32 / 2 + iVar32;
    uVar33 = 0;
    if (0 < (int)uVar46) {
      uVar33 = (ulong)uVar46;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar17 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar17 = *piVar17 + 1;
    }
    __dest_01 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(uVar33 * 0x30,GImAllocatorUserData);
    pIVar16 = (pIVar20->BeginPopupStack).Data;
    if (pIVar16 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_01,pIVar16,(long)(pIVar20->BeginPopupStack).Size * 0x30);
      pIVar16 = (pIVar20->BeginPopupStack).Data;
      if ((pIVar16 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar17 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar17 = *piVar17 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar16,GImAllocatorUserData);
    }
    (pIVar20->BeginPopupStack).Data = __dest_01;
    (pIVar20->BeginPopupStack).Capacity = (int)uVar33;
  }
  (pIVar20->BeginPopupStack).Size = 0;
  iVar32 = (pIVar20->ItemFlagsStack).Capacity;
  if (iVar32 < 0) {
    uVar46 = iVar32 / 2 + iVar32;
    uVar33 = 0;
    if (0 < (int)uVar46) {
      uVar33 = (ulong)uVar46;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar17 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar17 = *piVar17 + 1;
    }
    piVar28 = (int *)(*GImAllocatorAllocFunc)(uVar33 * 4,GImAllocatorUserData);
    piVar17 = (pIVar20->ItemFlagsStack).Data;
    if (piVar17 != (int *)0x0) {
      memcpy(piVar28,piVar17,(long)(pIVar20->ItemFlagsStack).Size << 2);
      piVar17 = (pIVar20->ItemFlagsStack).Data;
      if ((piVar17 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar4 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar4 = *piVar4 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar17,GImAllocatorUserData);
    }
    (pIVar20->ItemFlagsStack).Data = piVar28;
    (pIVar20->ItemFlagsStack).Capacity = (int)uVar33;
  }
  (pIVar20->ItemFlagsStack).Size = 0;
  if ((pIVar20->ItemFlagsStack).Capacity == 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar17 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar17 = *piVar17 + 1;
    }
    piVar28 = (int *)(*GImAllocatorAllocFunc)(0x20,GImAllocatorUserData);
    piVar17 = (pIVar20->ItemFlagsStack).Data;
    if (piVar17 != (int *)0x0) {
      memcpy(piVar28,piVar17,(long)(pIVar20->ItemFlagsStack).Size << 2);
      piVar17 = (pIVar20->ItemFlagsStack).Data;
      if ((piVar17 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar4 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar4 = *piVar4 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar17,GImAllocatorUserData);
    }
    (pIVar20->ItemFlagsStack).Data = piVar28;
    (pIVar20->ItemFlagsStack).Capacity = 8;
  }
  (pIVar20->ItemFlagsStack).Data[(pIVar20->ItemFlagsStack).Size] = 0;
  (pIVar20->ItemFlagsStack).Size = (pIVar20->ItemFlagsStack).Size + 1;
  iVar32 = (pIVar20->GroupStack).Capacity;
  if (iVar32 < 0) {
    uVar46 = iVar32 / 2 + iVar32;
    uVar33 = 0;
    if (0 < (int)uVar46) {
      uVar33 = (ulong)uVar46;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar17 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar17 = *piVar17 + 1;
    }
    __dest_02 = (ImGuiGroupData *)(*GImAllocatorAllocFunc)(uVar33 * 0x30,GImAllocatorUserData);
    pIVar18 = (pIVar20->GroupStack).Data;
    if (pIVar18 != (ImGuiGroupData *)0x0) {
      memcpy(__dest_02,pIVar18,(long)(pIVar20->GroupStack).Size * 0x30);
      pIVar18 = (pIVar20->GroupStack).Data;
      if ((pIVar18 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar17 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar17 = *piVar17 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar18,GImAllocatorUserData);
    }
    (pIVar20->GroupStack).Data = __dest_02;
    (pIVar20->GroupStack).Capacity = (int)uVar33;
  }
  (pIVar20->GroupStack).Size = 0;
  ClosePopupsOverWindow(pIVar20->NavWindow,false);
  pIVar21 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar21->DebugItemPickerActive == true) {
    uVar46 = pIVar21->HoveredIdPreviousFrame;
    pIVar21->MouseCursor = 7;
    iVar32 = (pIVar21->IO).KeyMap[0xe];
    if ((-1 < iVar32) && (bVar24 = IsKeyPressed(iVar32,true), bVar24)) {
      pIVar21->DebugItemPickerActive = false;
    }
    pIVar22 = GImGui;
    if (uVar46 != 0 && (GImGui->IO).MouseDownDuration[0] == 0.0) {
      pIVar21->DebugItemPickerBreakId = uVar46;
      pIVar21->DebugItemPickerActive = false;
    }
    pIVar5 = &pIVar22->NextWindowData;
    *(byte *)&pIVar5->Flags = (byte)pIVar5->Flags | 0x40;
    (pIVar22->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltipEx(0,0);
    Text("HoveredId: 0x%08X",(ulong)uVar46);
    Text("Press ESC to abort picking.");
    TextColored((GImGui->Style).Colors + (uVar46 == 0),"Click to break in debugger!");
    EndTooltip();
  }
  pIVar20->WithinFrameScopeWithImplicitWindow = true;
  pIVar21 = GImGui;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
  (pIVar21->NextWindowData).SizeVal.x = 400.0;
  (pIVar21->NextWindowData).SizeVal.y = 400.0;
  (pIVar21->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  if (pIVar20->CurrentWindow->IsFallbackWindow != false) {
    if (0 < (pIVar20->Hooks).Size) {
      lVar42 = 0;
      lVar43 = 0;
      do {
        pIVar12 = (pIVar20->Hooks).Data;
        if (*(int *)(pIVar12 + lVar42) == 1) {
          (**(code **)(pIVar12 + lVar42 + 8))(pIVar20,pIVar12 + lVar42);
        }
        lVar43 = lVar43 + 1;
        lVar42 = lVar42 + 0x18;
      } while (lVar43 < (pIVar20->Hooks).Size);
    }
    return;
  }
  __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                ,0xf7d,"void ImGui::NewFrame()");
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleSegmentMaxError(g.Style.CircleSegmentMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    g.BackgroundDrawList._ResetForNewFrame();
    g.BackgroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.BackgroundDrawList.PushClipRectFullScreen();

    g.ForegroundDrawList._ResetForNewFrame();
    g.ForegroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.ForegroundDrawList.PushClipRectFullScreen();

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    g.DrawData.Clear();

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_Default_);
    g.GroupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}